

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void compact_array_suite::test_uint8(void)

{
  array<unsigned_char,_4UL> value;
  undefined4 local_b4;
  value_type input [6];
  iarchive in;
  
  input[4] = '\x03';
  input[5] = '\x04';
  input[0] = 0xa8;
  input[1] = '\x04';
  input[2] = '\x01';
  input[3] = '\x02';
  trial::protocol::bintoken::iarchive::iarchive<unsigned_char[6]>(&in,&input);
  value._M_elems[0] = 0xff;
  value._M_elems[1] = 0xff;
  value._M_elems[2] = 0xff;
  value._M_elems[3] = 0xff;
  trial::protocol::bintoken::iarchive::load_override<std::array<unsigned_char,4ul>>(&in,&value);
  local_b4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[0]","UINT8_C(0x01)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x66,"void compact_array_suite::test_uint8()",&value,&local_b4);
  local_b4 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[1]","UINT8_C(0x02)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x67,"void compact_array_suite::test_uint8()",value._M_elems + 1,&local_b4);
  local_b4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[2]","UINT8_C(0x03)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x68,"void compact_array_suite::test_uint8()",value._M_elems + 2,&local_b4);
  local_b4 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("value[3]","UINT8_C(0x04)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/iarchive_std_suite.cpp"
             ,0x69,"void compact_array_suite::test_uint8()",value._M_elems + 3,&local_b4);
  trial::protocol::bintoken::iarchive::~iarchive(&in);
  return;
}

Assistant:

void test_uint8()
{
    const value_type input[] = { token::code::array8_int8, 4 * token::int8::size,
                                 0x01,
                                 0x02,
                                 0x03,
                                 0x04 };
    format::iarchive in(input);
    std::array<std::uint8_t, 4> value = {{ std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max(),
                                           std::numeric_limits<std::uint8_t>::max() }};
    TRIAL_PROTOCOL_TEST_NO_THROW(in >> value);
    TRIAL_PROTOCOL_TEST_EQUAL(value[0], UINT8_C(0x01));
    TRIAL_PROTOCOL_TEST_EQUAL(value[1], UINT8_C(0x02));
    TRIAL_PROTOCOL_TEST_EQUAL(value[2], UINT8_C(0x03));
    TRIAL_PROTOCOL_TEST_EQUAL(value[3], UINT8_C(0x04));
}